

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O3

int main(void)

{
  int *piVar1;
  long lVar2;
  long lVar3;
  int a;
  int n2;
  int n1;
  vector<int> v1;
  vector<int> v2;
  int la;
  int fi;
  int po;
  int local_6c;
  int local_68;
  int local_64;
  vector<int> local_60;
  vector<int> local_48;
  int local_2c;
  int local_28;
  int local_24;
  
  local_60.mData = (int *)operator_new__(4);
  *local_60.mData = 0;
  local_60.mCap = 1;
  local_60.mSize = 0;
  local_48.mData = (int *)operator_new__(4);
  *local_48.mData = 0;
  local_48.mCap = 1;
  local_48.mSize = 0;
  __isoc99_scanf("%d",&local_64);
  CP::vector<int>::resize(&local_60,(long)local_64);
  if (0 < local_64) {
    lVar3 = 0;
    do {
      __isoc99_scanf("%d",&local_6c);
      local_60.mData[lVar3] = local_6c;
      lVar3 = lVar3 + 1;
    } while (lVar3 < local_64);
  }
  __isoc99_scanf("%d",&local_68);
  CP::vector<int>::resize(&local_48,(long)local_68);
  if (0 < local_68) {
    lVar3 = 0;
    do {
      __isoc99_scanf("%d",&local_6c);
      local_48.mData[lVar3] = local_6c;
      lVar3 = lVar3 + 1;
    } while (lVar3 < local_68);
  }
  __isoc99_scanf("%d %d %d",&local_24,&local_28,&local_2c);
  CP::vector<int>::insert
            (&local_60,local_60.mData + local_24,local_48.mData + local_28,local_48.mData + local_2c
            );
  puts("Result");
  piVar1 = local_60.mData;
  if (local_60.mSize != 0) {
    lVar2 = local_60.mSize << 2;
    lVar3 = 0;
    do {
      printf("%d ",(ulong)*(uint *)((long)piVar1 + lVar3));
      lVar3 = lVar3 + 4;
    } while (lVar2 != lVar3);
  }
  putchar(10);
  if (local_48.mData != (int *)0x0) {
    operator_delete__(local_48.mData);
  }
  if (local_60.mData != (int *)0x0) {
    operator_delete__(local_60.mData);
  }
  return 0;
}

Assistant:

int main() {
  CP::vector<int> v1,v2;
  //read vector
  int n1,n2,a;
  scanf("%d",&n1);
  v1.resize(n1);
  for (int i = 0;i < n1;i++) {
    scanf("%d",&a);
    v1[i] = a;
  }
  scanf("%d",&n2);
  v2.resize(n2);
  for (int i = 0;i < n2;i++) {
    scanf("%d",&a);
    v2[i] = a;
  }

  //read position
  int po,fi,la;
  scanf("%d %d %d",&po,&fi,&la);
  CP::vector<int>::iterator position,first,last;
  position = v1.begin() + po;
  first = v2.begin() + fi;
  last = v2.begin() + la;

  //call the function
  v1.insert(position,first,last);

  //display result;
  printf("Result\n");
  for (auto &x : v1) {
    printf("%d ",x);
  }
  printf("\n");

  return 0;
}